

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

uchar flatbuffers::JsonPrinter::GetFieldDefault<unsigned_char>(FieldDef *fd)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  uchar val;
  undefined8 uStack_8;
  
  uStack_8 = CONCAT71(in_register_00000001,in_AL) & 0xffffffffffffff;
  bVar1 = StringToNumber<unsigned_char>
                    ((fd->value).constant._M_dataplus._M_p,(uchar *)((long)&uStack_8 + 7));
  if (bVar1) {
    return uStack_8._7_1_;
  }
  __assert_fail("check",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_text.cpp"
                ,0xfb,
                "static T flatbuffers::JsonPrinter::GetFieldDefault(const FieldDef &) [T = unsigned char]"
               );
}

Assistant:

static T GetFieldDefault(const FieldDef &fd) {
    T val{};
    auto check = StringToNumber(fd.value.constant.c_str(), &val);
    (void)check;
    FLATBUFFERS_ASSERT(check);
    return val;
  }